

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O0

int anon_unknown.dwarf_1b3692::GetIntPow(int number,int power)

{
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  int result;
  int power_local;
  int number_local;
  
  if (power < 0) {
    if (number == 1) {
      local_1c = 1;
    }
    else {
      if (number == -1) {
        local_20 = 1;
        if ((power & 1U) != 0) {
          local_20 = -1;
        }
      }
      else {
        local_20 = 0;
      }
      local_1c = local_20;
    }
    power_local = local_1c;
  }
  else {
    local_18 = 1;
    result = number;
    for (local_14 = power; local_14 != 0; local_14 = (int)local_14 >> 1) {
      if ((local_14 & 1) != 0) {
        local_18 = result * local_18;
        local_14 = local_14 - 1;
      }
      result = result * result;
    }
    power_local = local_18;
  }
  return power_local;
}

Assistant:

int GetIntPow(int number, int power)
	{
		if(power < 0)
			return number == 1 ? 1 : (number == -1 ? ((power & 1) ? -1 : 1) : 0);

		int result = 1;
		while(power)
		{
			if(power & 1)
			{
				result *= number;
				power--;
			}
			number *= number;
			power >>= 1;
		}
		return result;
	}